

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O1

void __thiscall
absl::lts_20240722::container_internal::
raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::FileDescriptor_const*>,absl::lts_20240722::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Eq,std::allocator<google::protobuf::FileDescriptor_const*>>
::emplace_at<google::protobuf::FileDescriptor_const*const&>
          (raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::FileDescriptor_const*>,absl::lts_20240722::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Eq,std::allocator<google::protobuf::FileDescriptor_const*>>
           *this,iterator iter,FileDescriptor **args)

{
  bool bVar1;
  reference key;
  iterator local_40;
  iterator local_30;
  iterator local_20;
  
  local_20.field_1 = iter.field_1;
  local_20.ctrl_ = iter.ctrl_;
  *local_20.field_1.slot_ = *args;
  key = raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
        ::iterator::operator*(&local_20);
  local_30 = find<google::protobuf::FileDescriptor_const*>
                       (this,(key_arg<const_google::protobuf::FileDescriptor_*> *)key);
  local_40.ctrl_ = local_20.ctrl_;
  local_40.field_1.slot_ = local_20.field_1.slot_;
  bVar1 = container_internal::operator==(&local_30,&local_40);
  if (bVar1) {
    return;
  }
  __assert_fail("PolicyTraits::apply(FindElement{*this}, *iter) == iter && \"constructed value does not match the lookup key\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                ,0xf3f,
                "void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const google::protobuf::FileDescriptor *>, absl::container_internal::HashEq<const google::protobuf::FileDescriptor *>::Hash, absl::container_internal::HashEq<const google::protobuf::FileDescriptor *>::Eq, std::allocator<const google::protobuf::FileDescriptor *>>::emplace_at(iterator, Args &&...) [Policy = absl::container_internal::FlatHashSetPolicy<const google::protobuf::FileDescriptor *>, Hash = absl::container_internal::HashEq<const google::protobuf::FileDescriptor *>::Hash, Eq = absl::container_internal::HashEq<const google::protobuf::FileDescriptor *>::Eq, Alloc = std::allocator<const google::protobuf::FileDescriptor *>, Args = <const google::protobuf::FileDescriptor *const &>]"
               );
}

Assistant:

void emplace_at(iterator iter, Args&&... args) {
    construct(iter.slot(), std::forward<Args>(args)...);

    assert(PolicyTraits::apply(FindElement{*this}, *iter) == iter &&
           "constructed value does not match the lookup key");
  }